

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resload.cpp
# Opt level: O0

osfildef * __thiscall
CResLoader::open_res_file(CResLoader *this,char *respath,char *deflib,char *exerestype)

{
  long in_RCX;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  char fname_1 [4096];
  char fname [4096];
  osfildef *fp;
  char filepath [4096];
  char *in_stack_ffffffffffffcfb8;
  char *in_stack_ffffffffffffcfc8;
  char *in_stack_ffffffffffffcfd0;
  char *in_stack_ffffffffffffd038;
  char *in_stack_ffffffffffffd040;
  CResLoader *in_stack_ffffffffffffd048;
  char local_2038 [4104];
  FILE *local_1030;
  char local_1028 [4104];
  long local_20;
  char *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  if (*in_RDI == 0) {
    os_cvt_url_dir(local_1028,0x1000,in_RSI);
  }
  else {
    os_cvt_url_dir(local_2038,0x1000,in_RSI);
    os_build_full_path(in_stack_ffffffffffffcfd0,(size_t)in_stack_ffffffffffffcfc8,(char *)in_RDI,
                       in_stack_ffffffffffffcfb8);
  }
  local_1030 = fopen(local_1028,"rb");
  if ((local_1030 == (FILE *)0x0) && (local_18 != (char *)0x0)) {
    os_cvt_url_dir(&stack0xffffffffffffcfc8,0x1000,local_18);
    os_build_full_path(in_stack_ffffffffffffcfd0,(size_t)in_stack_ffffffffffffcfc8,(char *)in_RDI,
                       in_stack_ffffffffffffcfb8);
    os_defext(in_stack_ffffffffffffcfd0,in_stack_ffffffffffffcfc8);
    local_1030 = (FILE *)open_lib_res(in_stack_ffffffffffffd048,in_stack_ffffffffffffd040,
                                      in_stack_ffffffffffffd038);
  }
  if ((local_1030 == (FILE *)0x0) && (local_20 != 0)) {
    local_1030 = (FILE *)open_exe_res(in_stack_ffffffffffffd048,in_stack_ffffffffffffd040,
                                      in_stack_ffffffffffffd038);
  }
  return (osfildef *)local_1030;
}

Assistant:

osfildef *CResLoader::open_res_file(const char *respath,
                                    const char *deflib,
                                    const char *exerestype)
{
    char filepath[OSFNMAX];
    osfildef *fp;
    
    /* 
     *   Look for the resource as an external file.  If we have a root
     *   directory, look for the file under that directory; otherwise,
     *   look for it in the current directory.  
     */
    if (root_dir_ != 0)
    {
        /* get the resource name as a file path */
        char fname[OSFNMAX];
        os_cvt_url_dir(fname, sizeof(fname), respath);

        /* build a full path from the root directory and the resource path */
        os_build_full_path(filepath, sizeof(filepath), root_dir_, fname);
    }
    else
    {
        /* get the resource name as a file path */
        os_cvt_url_dir(filepath, sizeof(filepath), respath);
    }

    /* try opening the file */
    fp = osfoprb(filepath, OSFTBIN);

    /* if we didn't find it, try looking in the default library */
    if (fp == 0 && deflib != 0)
    {
        char fname[OSFNMAX];

        /* convert from URL notation to local path conventions */
        os_cvt_url_dir(fname, sizeof(fname), deflib);

        /* build the full path, starting in the root resource directory */
        os_build_full_path(filepath, sizeof(filepath), root_dir_, fname);

        /* add the default resource library extension */
        os_defext(filepath, "t3r");

        /* try opening the file */
        fp = open_lib_res(filepath, respath);
    }

    /* if we still didn't find it, try looking in the executable */
    if (fp == 0 && exerestype != 0)
        fp = open_exe_res(respath, exerestype);

    /* return the result */
    return fp;
}